

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O3

void do_crop_ext_flat(j_decompress_ptr srcinfo,j_compress_ptr dstinfo,JDIMENSION x_crop_offset,
                     JDIMENSION y_crop_offset,jvirt_barray_ptr *src_coef_arrays,
                     jvirt_barray_ptr *dst_coef_arrays)

{
  JCOEF JVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  JDIMENSION JVar7;
  jpeg_component_info *pjVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint num_blocks;
  JBLOCKARRAY ppaJVar12;
  jpeg_memory_mgr *pjVar13;
  JBLOCKARRAY ppaJVar14;
  JBLOCKROW paJVar15;
  uint uVar16;
  ulong uVar17;
  jvirt_barray_ptr pjVar18;
  JBLOCKROW paJVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  uint uVar23;
  JBLOCKROW paJVar25;
  uint uVar26;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int iVar46;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  int iVar58;
  undefined1 in_XMM6 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  int iVar59;
  undefined1 auVar57 [16];
  int iVar60;
  int iVar63;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar64 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar65 [16];
  long lVar67;
  undefined1 auVar66 [16];
  ulong uVar24;
  
  uVar2 = srcinfo->output_width;
  iVar58 = dstinfo->num_components;
  iVar3 = dstinfo->max_h_samp_factor;
  if (0 < iVar58) {
    uVar4 = srcinfo->output_height;
    iVar5 = dstinfo->max_v_samp_factor;
    lVar22 = 0;
    do {
      pjVar8 = dstinfo->comp_info;
      if (pjVar8[lVar22].height_in_blocks != 0) {
        uVar6 = pjVar8[lVar22].v_samp_factor;
        uVar17 = (ulong)uVar6;
        num_blocks = pjVar8[lVar22].h_samp_factor * (uVar2 / (uint)(iVar3 << 3));
        uVar16 = uVar6 * y_crop_offset;
        uVar23 = pjVar8[lVar22].h_samp_factor * x_crop_offset;
        uVar24 = (ulong)uVar23;
        uVar23 = uVar23 + num_blocks;
        lVar27 = uVar24 - 1;
        auVar28._8_4_ = (int)lVar27;
        auVar28._0_8_ = lVar27;
        auVar28._12_4_ = (int)((ulong)lVar27 >> 0x20);
        uVar26 = 0;
        do {
          ppaJVar12 = (*srcinfo->mem->access_virt_barray)
                                ((j_common_ptr)srcinfo,dst_coef_arrays[lVar22],uVar26,
                                 (JDIMENSION)uVar17,1);
          if (srcinfo->output_height < dstinfo->image_height) {
            if ((uVar16 <= uVar26) &&
               (uVar26 < uVar6 * (uVar4 / (uint)(iVar5 << 3) + y_crop_offset))) {
              pjVar13 = srcinfo->mem;
              pjVar18 = src_coef_arrays[lVar22];
              JVar7 = pjVar8[lVar22].v_samp_factor;
              uVar9 = -uVar16;
              goto LAB_00113b8f;
            }
            uVar17 = (ulong)(uint)pjVar8[lVar22].v_samp_factor;
            if (0 < pjVar8[lVar22].v_samp_factor) {
              lVar27 = 0;
              do {
                memset(ppaJVar12[lVar27],0,(ulong)pjVar8[lVar22].width_in_blocks << 7);
                lVar27 = lVar27 + 1;
                uVar17 = (ulong)pjVar8[lVar22].v_samp_factor;
              } while (lVar27 < (long)uVar17);
            }
          }
          else {
            pjVar13 = srcinfo->mem;
            pjVar18 = src_coef_arrays[lVar22];
            JVar7 = pjVar8[lVar22].v_samp_factor;
            uVar9 = uVar16;
LAB_00113b8f:
            ppaJVar14 = (*pjVar13->access_virt_barray)
                                  ((j_common_ptr)srcinfo,pjVar18,uVar26 + uVar9,JVar7,0);
            uVar17 = (ulong)(uint)pjVar8[lVar22].v_samp_factor;
            if (0 < pjVar8[lVar22].v_samp_factor) {
              lVar27 = 0;
              do {
                if (uVar24 == 0) {
                  paJVar25 = ppaJVar14[lVar27];
                  paJVar19 = ppaJVar12[lVar27];
                }
                else {
                  memset(ppaJVar12[lVar27],0,uVar24 * 0x80);
                  auVar11 = _DAT_0015ed70;
                  auVar10 = _DAT_0015d0d0;
                  auVar38._8_4_ = 0xffffffff;
                  auVar38._0_8_ = 0xffffffffffffffff;
                  auVar38._12_4_ = 0xffffffff;
                  paJVar25 = ppaJVar14[lVar27];
                  JVar1 = (*paJVar25)[0];
                  paJVar19 = ppaJVar12[lVar27];
                  paJVar15 = paJVar19 + 7;
                  uVar17 = uVar24 + 7 & 0xfffffffffffffff8;
                  auVar29 = _DAT_0015d0c0;
                  auVar34 = _DAT_0015d0b0;
                  auVar53 = _DAT_0015d0a0;
                  auVar57 = _DAT_0015d090;
                  do {
                    auVar47 = auVar28 ^ auVar10;
                    auVar49 = auVar29 ^ auVar10;
                    iVar58 = auVar47._0_4_;
                    iVar60 = -(uint)(iVar58 < auVar49._0_4_);
                    iVar59 = auVar47._4_4_;
                    auVar50._4_4_ = -(uint)(iVar59 < auVar49._4_4_);
                    iVar46 = auVar47._8_4_;
                    iVar63 = -(uint)(iVar46 < auVar49._8_4_);
                    iVar31 = auVar47._12_4_;
                    auVar50._12_4_ = -(uint)(iVar31 < auVar49._12_4_);
                    auVar55._4_4_ = iVar60;
                    auVar55._0_4_ = iVar60;
                    auVar55._8_4_ = iVar63;
                    auVar55._12_4_ = iVar63;
                    auVar64 = pshuflw(in_XMM8,auVar55,0xe8);
                    auVar47._4_4_ = -(uint)(auVar49._4_4_ == iVar59);
                    auVar47._12_4_ = -(uint)(auVar49._12_4_ == iVar31);
                    auVar47._0_4_ = auVar47._4_4_;
                    auVar47._8_4_ = auVar47._12_4_;
                    auVar65 = pshuflw(in_XMM9,auVar47,0xe8);
                    auVar50._0_4_ = auVar50._4_4_;
                    auVar50._8_4_ = auVar50._12_4_;
                    auVar49 = pshuflw(auVar64,auVar50,0xe8);
                    auVar49 = (auVar49 | auVar65 & auVar64) ^ auVar38;
                    auVar49 = packssdw(auVar49,auVar49);
                    if ((auVar49 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      paJVar15[-7][0] = JVar1;
                    }
                    auVar50 = auVar47 & auVar55 | auVar50;
                    auVar47 = packssdw(auVar50,auVar50);
                    auVar47 = packssdw(auVar47 ^ auVar38,auVar47 ^ auVar38);
                    if ((auVar47._0_4_ >> 0x10 & 1) != 0) {
                      paJVar15[-6][0] = JVar1;
                    }
                    auVar47 = auVar34 ^ auVar10;
                    iVar60 = -(uint)(iVar58 < auVar47._0_4_);
                    auVar61._4_4_ = -(uint)(iVar59 < auVar47._4_4_);
                    iVar63 = -(uint)(iVar46 < auVar47._8_4_);
                    auVar61._12_4_ = -(uint)(iVar31 < auVar47._12_4_);
                    auVar49._4_4_ = iVar60;
                    auVar49._0_4_ = iVar60;
                    auVar49._8_4_ = iVar63;
                    auVar49._12_4_ = iVar63;
                    auVar54._4_4_ = -(uint)(auVar47._4_4_ == iVar59);
                    auVar54._12_4_ = -(uint)(auVar47._12_4_ == iVar31);
                    auVar54._0_4_ = auVar54._4_4_;
                    auVar54._8_4_ = auVar54._12_4_;
                    auVar61._0_4_ = auVar61._4_4_;
                    auVar61._8_4_ = auVar61._12_4_;
                    auVar47 = auVar54 & auVar49 | auVar61;
                    auVar47 = packssdw(auVar47,auVar47);
                    auVar47 = packssdw(auVar47 ^ auVar38,auVar47 ^ auVar38);
                    if ((auVar47 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      paJVar15[-5][0] = JVar1;
                    }
                    auVar49 = pshufhw(auVar49,auVar49,0x84);
                    auVar55 = pshufhw(auVar54,auVar54,0x84);
                    auVar50 = pshufhw(auVar49,auVar61,0x84);
                    auVar49 = (auVar50 | auVar55 & auVar49) ^ auVar38;
                    auVar49 = packssdw(auVar49,auVar49);
                    if ((auVar49 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      paJVar15[-4][0] = JVar1;
                    }
                    auVar49 = auVar53 ^ auVar10;
                    iVar60 = -(uint)(iVar58 < auVar49._0_4_);
                    auVar52._4_4_ = -(uint)(iVar59 < auVar49._4_4_);
                    iVar63 = -(uint)(iVar46 < auVar49._8_4_);
                    auVar52._12_4_ = -(uint)(iVar31 < auVar49._12_4_);
                    auVar56._4_4_ = iVar60;
                    auVar56._0_4_ = iVar60;
                    auVar56._8_4_ = iVar63;
                    auVar56._12_4_ = iVar63;
                    auVar47 = pshuflw(auVar47,auVar56,0xe8);
                    auVar51._4_4_ = -(uint)(auVar49._4_4_ == iVar59);
                    auVar51._12_4_ = -(uint)(auVar49._12_4_ == iVar31);
                    auVar51._0_4_ = auVar51._4_4_;
                    auVar51._8_4_ = auVar51._12_4_;
                    in_XMM9 = pshuflw(auVar65 & auVar64,auVar51,0xe8);
                    in_XMM9 = in_XMM9 & auVar47;
                    auVar52._0_4_ = auVar52._4_4_;
                    auVar52._8_4_ = auVar52._12_4_;
                    auVar47 = pshuflw(auVar47,auVar52,0xe8);
                    auVar47 = (auVar47 | in_XMM9) ^ auVar38;
                    auVar47 = packssdw(auVar47,auVar47);
                    if ((auVar47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      paJVar15[-3][0] = JVar1;
                    }
                    auVar52 = auVar51 & auVar56 | auVar52;
                    auVar47 = packssdw(auVar52,auVar52);
                    auVar47 = packssdw(auVar47 ^ auVar38,auVar47 ^ auVar38);
                    if ((auVar47 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                      paJVar15[-2][0] = JVar1;
                    }
                    auVar47 = auVar57 ^ auVar10;
                    auVar62._0_4_ = -(uint)(iVar58 < auVar47._0_4_);
                    auVar62._4_4_ = -(uint)(iVar59 < auVar47._4_4_);
                    auVar62._8_4_ = -(uint)(iVar46 < auVar47._8_4_);
                    auVar62._12_4_ = -(uint)(iVar31 < auVar47._12_4_);
                    auVar65._4_4_ = auVar62._0_4_;
                    auVar65._0_4_ = auVar62._0_4_;
                    auVar65._8_4_ = auVar62._8_4_;
                    auVar65._12_4_ = auVar62._8_4_;
                    iVar58 = -(uint)(auVar47._4_4_ == iVar59);
                    iVar59 = -(uint)(auVar47._12_4_ == iVar31);
                    auVar64._4_4_ = iVar58;
                    auVar64._0_4_ = iVar58;
                    auVar64._8_4_ = iVar59;
                    auVar64._12_4_ = iVar59;
                    in_XMM6._4_4_ = auVar62._4_4_;
                    in_XMM6._0_4_ = auVar62._4_4_;
                    in_XMM6._8_4_ = auVar62._12_4_;
                    in_XMM6._12_4_ = auVar62._12_4_;
                    in_XMM8 = auVar64 & auVar65 | in_XMM6;
                    auVar47 = packssdw(auVar62,in_XMM8);
                    auVar47 = packssdw(auVar47 ^ auVar38,auVar47 ^ auVar38);
                    if ((auVar47 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      paJVar15[-1][0] = JVar1;
                    }
                    auVar49 = pshufhw(auVar65,auVar65,0x84);
                    auVar47 = pshufhw(auVar64,auVar64,0x84);
                    auVar50 = pshufhw(auVar49,in_XMM6,0x84);
                    in_XMM5 = (auVar50 | auVar47 & auVar49) ^ auVar38;
                    auVar47 = packssdw(auVar47 & auVar49,in_XMM5);
                    if ((auVar47 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      (*paJVar15)[0] = JVar1;
                    }
                    lVar20 = auVar29._8_8_;
                    lVar21 = auVar11._0_8_;
                    auVar29._0_8_ = auVar29._0_8_ + lVar21;
                    lVar67 = auVar11._8_8_;
                    auVar29._8_8_ = lVar20 + lVar67;
                    lVar20 = auVar34._8_8_;
                    auVar34._0_8_ = auVar34._0_8_ + lVar21;
                    auVar34._8_8_ = lVar20 + lVar67;
                    lVar20 = auVar53._8_8_;
                    auVar53._0_8_ = auVar53._0_8_ + lVar21;
                    auVar53._8_8_ = lVar20 + lVar67;
                    lVar20 = auVar57._8_8_;
                    auVar57._0_8_ = auVar57._0_8_ + lVar21;
                    auVar57._8_8_ = lVar20 + lVar67;
                    paJVar15 = paJVar15 + 8;
                    uVar17 = uVar17 - 8;
                  } while (uVar17 != 0);
                }
                jcopy_block_row(paJVar25,paJVar19 + uVar24,num_blocks);
                if (uVar23 < pjVar8[lVar22].width_in_blocks) {
                  memset(ppaJVar12[lVar27] + uVar24 + num_blocks,0,
                         (ulong)(pjVar8[lVar22].width_in_blocks - uVar23) << 7);
                  auVar29 = _DAT_0015d0d0;
                  auVar11 = _DAT_0015d0c0;
                  in_XMM9 = _DAT_0015d0b0;
                  in_XMM8 = _DAT_0015d0a0;
                  auVar10 = _DAT_0015d090;
                  auVar66._8_4_ = 0xffffffff;
                  auVar66._0_8_ = 0xffffffffffffffff;
                  auVar66._12_4_ = 0xffffffff;
                  if (uVar23 < pjVar8[lVar22].width_in_blocks) {
                    JVar1 = ppaJVar14[lVar27][num_blocks - 1][0];
                    paJVar25 = ppaJVar12[lVar27];
                    lVar20 = (ulong)pjVar8[lVar22].width_in_blocks - (ulong)uVar23;
                    lVar21 = lVar20 + -1;
                    auVar30._8_4_ = (int)lVar21;
                    auVar30._0_8_ = lVar21;
                    auVar30._12_4_ = (int)((ulong)lVar21 >> 0x20);
                    auVar30 = auVar30 ^ _DAT_0015d0d0;
                    uVar17 = 0;
                    do {
                      lVar21 = uVar17 + uVar23;
                      auVar32._8_4_ = (int)uVar17;
                      auVar32._0_8_ = uVar17;
                      auVar32._12_4_ = (int)(uVar17 >> 0x20);
                      auVar34 = (auVar32 | auVar11) ^ auVar29;
                      iVar58 = auVar30._0_4_;
                      iVar60 = -(uint)(iVar58 < auVar34._0_4_);
                      iVar59 = auVar30._4_4_;
                      auVar36._4_4_ = -(uint)(iVar59 < auVar34._4_4_);
                      iVar46 = auVar30._8_4_;
                      iVar63 = -(uint)(iVar46 < auVar34._8_4_);
                      iVar31 = auVar30._12_4_;
                      auVar36._12_4_ = -(uint)(iVar31 < auVar34._12_4_);
                      auVar42._4_4_ = iVar60;
                      auVar42._0_4_ = iVar60;
                      auVar42._8_4_ = iVar63;
                      auVar42._12_4_ = iVar63;
                      auVar53 = pshuflw(in_XMM5,auVar42,0xe8);
                      auVar35._4_4_ = -(uint)(auVar34._4_4_ == iVar59);
                      auVar35._12_4_ = -(uint)(auVar34._12_4_ == iVar31);
                      auVar35._0_4_ = auVar35._4_4_;
                      auVar35._8_4_ = auVar35._12_4_;
                      auVar57 = pshuflw(in_XMM6,auVar35,0xe8);
                      auVar36._0_4_ = auVar36._4_4_;
                      auVar36._8_4_ = auVar36._12_4_;
                      auVar34 = pshuflw(auVar53,auVar36,0xe8);
                      auVar34 = (auVar34 | auVar57 & auVar53) ^ auVar66;
                      auVar34 = packssdw(auVar34,auVar34);
                      if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        paJVar25[lVar21][0] = JVar1;
                      }
                      auVar36 = auVar35 & auVar42 | auVar36;
                      auVar34 = packssdw(auVar36,auVar36);
                      auVar34 = packssdw(auVar34 ^ auVar66,auVar34 ^ auVar66);
                      if ((auVar34._0_4_ >> 0x10 & 1) != 0) {
                        paJVar25[lVar21 + 1][0] = JVar1;
                      }
                      auVar34 = (auVar32 | in_XMM9) ^ auVar29;
                      iVar60 = -(uint)(iVar58 < auVar34._0_4_);
                      auVar48._4_4_ = -(uint)(iVar59 < auVar34._4_4_);
                      iVar63 = -(uint)(iVar46 < auVar34._8_4_);
                      auVar48._12_4_ = -(uint)(iVar31 < auVar34._12_4_);
                      auVar37._4_4_ = iVar60;
                      auVar37._0_4_ = iVar60;
                      auVar37._8_4_ = iVar63;
                      auVar37._12_4_ = iVar63;
                      auVar43._4_4_ = -(uint)(auVar34._4_4_ == iVar59);
                      auVar43._12_4_ = -(uint)(auVar34._12_4_ == iVar31);
                      auVar43._0_4_ = auVar43._4_4_;
                      auVar43._8_4_ = auVar43._12_4_;
                      auVar48._0_4_ = auVar48._4_4_;
                      auVar48._8_4_ = auVar48._12_4_;
                      auVar34 = auVar43 & auVar37 | auVar48;
                      auVar34 = packssdw(auVar34,auVar34);
                      auVar34 = packssdw(auVar34 ^ auVar66,auVar34 ^ auVar66);
                      if ((auVar34 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        paJVar25[lVar21 + 2][0] = JVar1;
                      }
                      auVar38 = pshufhw(auVar37,auVar37,0x84);
                      auVar49 = pshufhw(auVar43,auVar43,0x84);
                      auVar47 = pshufhw(auVar38,auVar48,0x84);
                      auVar38 = (auVar47 | auVar49 & auVar38) ^ auVar66;
                      auVar38 = packssdw(auVar38,auVar38);
                      if ((auVar38 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        paJVar25[lVar21 + 3][0] = JVar1;
                      }
                      auVar38 = (auVar32 | in_XMM8) ^ auVar29;
                      iVar60 = -(uint)(iVar58 < auVar38._0_4_);
                      auVar40._4_4_ = -(uint)(iVar59 < auVar38._4_4_);
                      iVar63 = -(uint)(iVar46 < auVar38._8_4_);
                      auVar40._12_4_ = -(uint)(iVar31 < auVar38._12_4_);
                      auVar44._4_4_ = iVar60;
                      auVar44._0_4_ = iVar60;
                      auVar44._8_4_ = iVar63;
                      auVar44._12_4_ = iVar63;
                      auVar34 = pshuflw(auVar34,auVar44,0xe8);
                      auVar39._4_4_ = -(uint)(auVar38._4_4_ == iVar59);
                      auVar39._12_4_ = -(uint)(auVar38._12_4_ == iVar31);
                      auVar39._0_4_ = auVar39._4_4_;
                      auVar39._8_4_ = auVar39._12_4_;
                      in_XMM6 = pshuflw(auVar57 & auVar53,auVar39,0xe8);
                      in_XMM6 = in_XMM6 & auVar34;
                      auVar40._0_4_ = auVar40._4_4_;
                      auVar40._8_4_ = auVar40._12_4_;
                      auVar34 = pshuflw(auVar34,auVar40,0xe8);
                      auVar34 = (auVar34 | in_XMM6) ^ auVar66;
                      in_XMM5 = packssdw(auVar34,auVar34);
                      if ((in_XMM5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        paJVar25[lVar21 + 4][0] = JVar1;
                      }
                      auVar40 = auVar39 & auVar44 | auVar40;
                      auVar34 = packssdw(auVar40,auVar40);
                      auVar34 = packssdw(auVar34 ^ auVar66,auVar34 ^ auVar66);
                      if ((auVar34 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                        paJVar25[lVar21 + 5][0] = JVar1;
                      }
                      auVar34 = (auVar32 | auVar10) ^ auVar29;
                      iVar58 = -(uint)(iVar58 < auVar34._0_4_);
                      auVar45._4_4_ = -(uint)(iVar59 < auVar34._4_4_);
                      iVar46 = -(uint)(iVar46 < auVar34._8_4_);
                      auVar45._12_4_ = -(uint)(iVar31 < auVar34._12_4_);
                      auVar41._4_4_ = iVar58;
                      auVar41._0_4_ = iVar58;
                      auVar41._8_4_ = iVar46;
                      auVar41._12_4_ = iVar46;
                      auVar33._4_4_ = -(uint)(auVar34._4_4_ == iVar59);
                      auVar33._12_4_ = -(uint)(auVar34._12_4_ == iVar31);
                      auVar33._0_4_ = auVar33._4_4_;
                      auVar33._8_4_ = auVar33._12_4_;
                      auVar45._0_4_ = auVar45._4_4_;
                      auVar45._8_4_ = auVar45._12_4_;
                      auVar34 = auVar33 & auVar41 | auVar45;
                      auVar34 = packssdw(auVar34,auVar34);
                      auVar34 = packssdw(auVar34 ^ auVar66,auVar34 ^ auVar66);
                      if ((auVar34 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        paJVar25[lVar21 + 6][0] = JVar1;
                      }
                      auVar53 = pshufhw(auVar41,auVar41,0x84);
                      auVar34 = pshufhw(auVar33,auVar33,0x84);
                      auVar57 = pshufhw(auVar53,auVar45,0x84);
                      auVar34 = packssdw(auVar34 & auVar53,(auVar57 | auVar34 & auVar53) ^ auVar66);
                      if ((auVar34 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        paJVar25[lVar21 + 7][0] = JVar1;
                      }
                      uVar17 = uVar17 + 8;
                    } while ((lVar20 + 7U & 0xfffffffffffffff8) != uVar17);
                  }
                }
                lVar27 = lVar27 + 1;
                uVar17 = (ulong)pjVar8[lVar22].v_samp_factor;
              } while (lVar27 < (long)uVar17);
            }
          }
          uVar26 = uVar26 + (int)uVar17;
        } while (uVar26 < pjVar8[lVar22].height_in_blocks);
        iVar58 = dstinfo->num_components;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 < iVar58);
  }
  return;
}

Assistant:

LOCAL(void)
do_crop_ext_flat(j_decompress_ptr srcinfo, j_compress_ptr dstinfo,
                 JDIMENSION x_crop_offset, JDIMENSION y_crop_offset,
                 jvirt_barray_ptr *src_coef_arrays,
                 jvirt_barray_ptr *dst_coef_arrays)
/* Crop.  This is only used when no rotate/flip is requested with the crop.
 * Extension: The destination width is larger than the source, and we fill in
 * the expanded region with the DC coefficient of the adjacent block.  Note
 * that we also have to fill partial iMCUs at the right and bottom edge of the
 * source image area in this case.
 */
{
  JDIMENSION MCU_cols, MCU_rows, comp_width, comp_height;
  JDIMENSION dst_blk_x, dst_blk_y, x_crop_blocks, y_crop_blocks;
  int ci, offset_y;
  JCOEF dc;
  JBLOCKARRAY src_buffer, dst_buffer;
  jpeg_component_info *compptr;

  MCU_cols = srcinfo->output_width /
             (dstinfo->max_h_samp_factor * dstinfo_min_DCT_h_scaled_size);
  MCU_rows = srcinfo->output_height /
             (dstinfo->max_v_samp_factor * dstinfo_min_DCT_v_scaled_size);

  for (ci = 0; ci < dstinfo->num_components; ci++) {
    compptr = dstinfo->comp_info + ci;
    comp_width = MCU_cols * compptr->h_samp_factor;
    comp_height = MCU_rows * compptr->v_samp_factor;
    x_crop_blocks = x_crop_offset * compptr->h_samp_factor;
    y_crop_blocks = y_crop_offset * compptr->v_samp_factor;
    for (dst_blk_y = 0; dst_blk_y < compptr->height_in_blocks;
         dst_blk_y += compptr->v_samp_factor) {
      dst_buffer = (*srcinfo->mem->access_virt_barray)
        ((j_common_ptr)srcinfo, dst_coef_arrays[ci], dst_blk_y,
         (JDIMENSION)compptr->v_samp_factor, TRUE);
      if (dstinfo->_jpeg_height > srcinfo->output_height) {
        if (dst_blk_y < y_crop_blocks ||
            dst_blk_y >= y_crop_blocks + comp_height) {
          for (offset_y = 0; offset_y < compptr->v_samp_factor; offset_y++) {
            MEMZERO(dst_buffer[offset_y],
                    compptr->width_in_blocks * sizeof(JBLOCK));
          }
          continue;
        }
        src_buffer = (*srcinfo->mem->access_virt_barray)
          ((j_common_ptr)srcinfo, src_coef_arrays[ci],
           dst_blk_y - y_crop_blocks, (JDIMENSION)compptr->v_samp_factor,
           FALSE);
      } else {
        src_buffer = (*srcinfo->mem->access_virt_barray)
          ((j_common_ptr)srcinfo, src_coef_arrays[ci],
           dst_blk_y + y_crop_blocks, (JDIMENSION)compptr->v_samp_factor,
          FALSE);
      }
      for (offset_y = 0; offset_y < compptr->v_samp_factor; offset_y++) {
        if (x_crop_blocks > 0) {
          MEMZERO(dst_buffer[offset_y], x_crop_blocks * sizeof(JBLOCK));
          dc = src_buffer[offset_y][0][0];
          for (dst_blk_x = 0; dst_blk_x < x_crop_blocks; dst_blk_x++) {
            dst_buffer[offset_y][dst_blk_x][0] = dc;
          }
        }
        jcopy_block_row(src_buffer[offset_y],
                        dst_buffer[offset_y] + x_crop_blocks, comp_width);
        if (compptr->width_in_blocks > x_crop_blocks + comp_width) {
          MEMZERO(dst_buffer[offset_y] + x_crop_blocks + comp_width,
                  (compptr->width_in_blocks - x_crop_blocks - comp_width) *
                  sizeof(JBLOCK));
          dc = src_buffer[offset_y][comp_width - 1][0];
          for (dst_blk_x = x_crop_blocks + comp_width;
               dst_blk_x < compptr->width_in_blocks; dst_blk_x++) {
            dst_buffer[offset_y][dst_blk_x][0] = dc;
          }
        }
      }
    }
  }
}